

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plurrule.cpp
# Opt level: O3

UnicodeString * __thiscall
icu_63::PluralRules::getKeywordOther(UnicodeString *__return_storage_ptr__,PluralRules *this)

{
  ConstChar16Ptr local_20 [3];
  
  local_20[0].p_ = (char16_t *)PLURAL_KEYWORD_OTHER;
  UnicodeString::UnicodeString(__return_storage_ptr__,'\x01',local_20,5);
  return __return_storage_ptr__;
}

Assistant:

UnicodeString
PluralRules::getKeywordOther() const {
    return UnicodeString(TRUE, PLURAL_KEYWORD_OTHER, 5);
}